

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::VectorDeathTest_BoundsChecks_Test::TestBody
          (VectorDeathTest_BoundsChecks_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  char *in_R9;
  pointer *__ptr;
  DeathTest *gtest_dt;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined8 local_b8;
  AssertHelper local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  local_c8._M_allocated_capacity = 0;
  local_c8._8_8_ = 0;
  local_b8 = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x51b1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_e8,
               (testing *)&local_f8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_40,(PolymorphicMatcher *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("vec.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xa9,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_40);
    _Var7._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_003173ee;
    if ((element_type *)local_100._M_head_impl != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_003173ee;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2 && local_c8._8_8_ == 0) goto LAB_00317afa;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_00317441;
    }
  }
  else {
LAB_003173ee:
    testing::Message::Message((Message *)local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xa9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      lVar6 = *(long *)local_e8._0_8_;
      _Var7._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
      ;
LAB_00317441:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x51b1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_e8,
               (testing *)&local_f8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,(PolymorphicMatcher *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("vec.back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xaa,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_58);
    _Var7._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00317557;
    if ((element_type *)local_100._M_head_impl != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_00317557;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2 && local_c8._8_8_ == 0) goto LAB_00317afa;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_003175aa;
    }
  }
  else {
LAB_00317557:
    testing::Message::Message((Message *)local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xaa,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
      lVar6 = *(long *)local_e8._0_8_;
      _Var7._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
      ;
LAB_003175aa:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x51b1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_e8,
               (testing *)&local_f8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("vec.pop_back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xab,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    _Var7._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_003176c7;
    if ((element_type *)local_100._M_head_impl != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_003176c7;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          if (local_c8._8_8_ == 0) goto LAB_00317afa;
          local_c8._8_8_ = local_c8._8_8_ - 1;
        }
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_0031771a;
    }
  }
  else {
LAB_003176c7:
    testing::Message::Message((Message *)local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xab,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
      lVar6 = *(long *)local_e8._0_8_;
      _Var7._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
      ;
LAB_0031771a:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  bVar2 = Vector<int>::MaybeGrow((Vector<int> *)&local_c8);
  if (!bVar2) {
    local_f8.data_ = local_f8.data_ & 0xffffffffffffff00;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,(AssertionResult *)"vec.Push(1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xac,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((element_type *)local_100._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    goto LAB_00317adf;
  }
  *(undefined4 *)(local_c8._M_allocated_capacity + local_c8._8_8_ * 4) = 1;
  local_c8._8_8_ = local_c8._8_8_ + 1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x51b1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_e8,
               (testing *)&local_f8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("vec[1]",(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xae,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    _Var7._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00317926;
    if ((element_type *)local_100._M_head_impl != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
          goto LAB_00317926;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2 && (ulong)local_c8._8_8_ < 2) goto LAB_00317afa;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar6 = *(long *)_Var7._M_head_impl;
      goto LAB_00317979;
    }
  }
  else {
LAB_00317926:
    testing::Message::Message((Message *)local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xae,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
      lVar6 = *(long *)local_e8._0_8_;
      _Var7._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
      ;
LAB_00317979:
      (**(code **)(lVar6 + 8))(_Var7._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x51b1bf;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_e8,
               (testing *)&local_f8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("vec[10000]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0xb0,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    _Var7._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00317a89;
    if ((element_type *)local_100._M_head_impl == (element_type *)0x0) goto LAB_00317adf;
    iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
    _Var1._M_head_impl = local_100._M_head_impl;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x20))(local_100._M_head_impl,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)_Var7._M_head_impl + 8))(_Var7._M_head_impl);
        goto LAB_00317a89;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2 && (ulong)local_c8._8_8_ < 0x2711) {
LAB_00317afa:
        abort();
      }
      (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
      (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
    }
    lVar6 = *(long *)_Var7._M_head_impl;
    local_e8._0_8_ = _Var7._M_head_impl;
  }
  else {
LAB_00317a89:
    testing::Message::Message((Message *)local_e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0xb0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8._0_8_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00317adf;
    lVar6 = *(long *)local_e8._0_8_;
  }
  (**(code **)(lVar6 + 8))(local_e8._0_8_);
LAB_00317adf:
  OPENSSL_free((void *)local_c8._M_allocated_capacity);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}